

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O1

Fad<float> * __thiscall
TPZMatrix<Fad<float>_>::operator()
          (Fad<float> *__return_storage_ptr__,TPZMatrix<Fad<float>_> *this,int64_t row,int64_t col)

{
  if (((row < (this->super_TPZBaseMatrix).fRow) && (-1 < (col | row))) &&
     (col < (this->super_TPZBaseMatrix).fCol)) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
              (__return_storage_ptr__,this,row,col);
    return __return_storage_ptr__;
  }
  Error("TPZMatrix<TVar>::Operator()","Index out of range");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h",
             0x349);
}

Assistant:

inline TVar TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) const{
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return GetVal(row,col);
}